

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask_data(tst_RoleMaskProxyModel *this)

{
  initializer_list<QModelIndex> args;
  initializer_list<QModelIndex> args_00;
  initializer_list<QModelIndex> args_01;
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  bool local_1e1;
  QModelIndex local_1e0;
  undefined1 local_1c8 [24];
  QModelIndex local_1b0;
  QModelIndex local_198;
  QModelIndex local_180;
  undefined1 local_168 [24];
  undefined1 local_150 [24];
  iterator local_138;
  undefined8 local_130;
  QList<QModelIndex> local_128;
  bool local_109;
  QModelIndex local_108;
  QModelIndex local_f0;
  QModelIndex local_d8;
  undefined1 local_c0 [24];
  iterator local_a8;
  undefined8 local_a0;
  QList<QModelIndex> local_98;
  bool local_7d [13];
  QModelIndex local_70;
  QModelIndex local_58;
  iterator local_40;
  undefined8 local_38;
  QList<QModelIndex> local_30;
  QAbstractItemModel *local_18;
  QAbstractItemModel *baseModel;
  tst_RoleMaskProxyModel *this_local;
  
  baseModel = (QAbstractItemModel *)this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QList<QModelIndex>>("magicNumerIndexes",(QList<QModelIndex> *)0x0);
  QTest::addColumn<bool>("userRoleEditable",(bool *)0x0);
  local_18 = createListModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("List");
  pQVar2 = ::operator<<(pQVar2,&local_18);
  pQVar1 = local_18;
  QModelIndex::QModelIndex(&local_70);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,0,0,&local_70);
  local_38 = 1;
  args_01._M_len = 1;
  args_01._M_array = &local_58;
  local_40 = &local_58;
  QList<QModelIndex>::QList(&local_30,args_01);
  pQVar2 = ::operator<<(pQVar2,&local_30);
  local_7d[0] = false;
  ::operator<<(pQVar2,local_7d);
  QList<QModelIndex>::~QList(&local_30);
  local_18 = createTableModel(&this->super_QObject);
  if (local_18 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Table");
    pQVar2 = ::operator<<(pQVar2,&local_18);
    pQVar1 = local_18;
    QModelIndex::QModelIndex(&local_f0);
    (**(code **)(*(long *)pQVar1 + 0x60))();
    pQVar1 = local_18;
    QModelIndex::QModelIndex(&local_108);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_c0,pQVar1,0,1,&local_108);
    local_a0 = 2;
    args_00._M_len = 2;
    args_00._M_array = &local_d8;
    local_a8 = &local_d8;
    QList<QModelIndex>::QList(&local_98,args_00);
    pQVar2 = ::operator<<(pQVar2,&local_98);
    local_109 = true;
    ::operator<<(pQVar2,&local_109);
    QList<QModelIndex>::~QList(&local_98);
  }
  local_18 = createTreeModel(&this->super_QObject);
  if (local_18 != (QAbstractItemModel *)0x0) {
    pQVar2 = (QTestData *)QTest::newRow("Tree");
    pQVar2 = ::operator<<(pQVar2,&local_18);
    pQVar1 = local_18;
    QModelIndex::QModelIndex(&local_198);
    (**(code **)(*(long *)pQVar1 + 0x60))();
    pQVar1 = local_18;
    QModelIndex::QModelIndex(&local_1b0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_168,pQVar1,0,1,&local_1b0);
    pQVar1 = local_18;
    QModelIndex::QModelIndex(&local_1e0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_1c8,pQVar1,0,0,&local_1e0);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_150,pQVar1,0,1,local_1c8);
    local_130 = 3;
    args._M_len = 3;
    args._M_array = &local_180;
    local_138 = &local_180;
    QList<QModelIndex>::QList(&local_128,args);
    pQVar2 = ::operator<<(pQVar2,&local_128);
    local_1e1 = true;
    ::operator<<(pQVar2,&local_1e1);
    QList<QModelIndex>::~QList(&local_128);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask_data()
{
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndexList>("magicNumerIndexes");
    QTest::addColumn<bool>("userRoleEditable");
    QAbstractItemModel *baseModel = createListModel(this);
    QTest::newRow("List") << baseModel << QModelIndexList({baseModel->index(0, 0)}) << false;
    baseModel = createTableModel(this);
    if (baseModel)
        QTest::newRow("Table") << baseModel << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1)}) << true;
    baseModel = createTreeModel(this);
    if (baseModel)
        QTest::newRow("Tree") << baseModel
                              << QModelIndexList({baseModel->index(1, 0), baseModel->index(0, 1), baseModel->index(0, 1, baseModel->index(0, 0))})
                              << true;
}